

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImGui::DockNodeGetTabOrder(ImGuiWindow *window)

{
  ImGuiTabBar *this;
  long in_RDI;
  ImGuiTabItem *tab;
  ImGuiTabBar *tab_bar;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 local_4;
  
  if (*(long *)(*(long *)(in_RDI + 0x410) + 0x38) == 0) {
    local_4 = -1;
  }
  else {
    this = (ImGuiTabBar *)
           TabBarFindTabByID((ImGuiTabBar *)
                             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
    if (this == (ImGuiTabBar *)0x0) {
      local_4 = -1;
    }
    else {
      local_4 = ImGuiTabBar::GetTabOrder
                          (this,(ImGuiTabItem *)
                                CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    }
  }
  return local_4;
}

Assistant:

int ImGui::DockNodeGetTabOrder(ImGuiWindow* window)
{
    ImGuiTabBar* tab_bar = window->DockNode->TabBar;
    if (tab_bar == NULL)
        return -1;
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, window->ID);
    return tab ? tab_bar->GetTabOrder(tab) : -1;
}